

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O1

void __thiscall
xLearn::PARSER_TEST_Parse_libsvm_no_y_comma_Test::~PARSER_TEST_Parse_libsvm_no_y_comma_Test
          (PARSER_TEST_Parse_libsvm_no_y_comma_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PARSER_TEST, Parse_libsvm_no_y_comma) {
  write_data(Kfilename, kStrNoy_comma);
  char* buffer = nullptr;
  uint64 size = ReadFileToMemory(Kfilename, &buffer);
  DMatrix matrix;
  LibsvmParser parser;
  parser.setLabel(false);
  parser.setSplitor(",");
  parser.Parse(buffer, size, matrix, true);
  check(matrix, false, false);
  parser.Parse(buffer, size, matrix, false);
  check_double(matrix, false, false);
  parser.Parse(buffer, size, matrix, true);
  check(matrix, false, false);
  RemoveFile(Kfilename.c_str());
}